

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVMValidator.cpp
# Opt level: O0

Result * CoreML::validateKernel(Result *__return_storage_ptr__,Kernel *kernel)

{
  KernelCase KVar1;
  int32 iVar2;
  PolyKernel *pPVar3;
  RBFKernel *this;
  SigmoidKernel *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar4;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Kernel *local_18;
  Kernel *kernel_local;
  
  local_18 = kernel;
  kernel_local = (Kernel *)__return_storage_ptr__;
  KVar1 = Specification::Kernel::kernel_case(kernel);
  switch(KVar1) {
  case kPolyKernel:
    pPVar3 = Specification::Kernel::polykernel(local_18);
    dVar4 = Specification::PolyKernel::gamma(pPVar3,extraout_XMM0_Qa);
    if (dVar4 < 0.0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Gamma must be greater than or equal to zero",&local_39);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      return __return_storage_ptr__;
    }
    pPVar3 = Specification::Kernel::polykernel(local_18);
    iVar2 = Specification::PolyKernel::degree(pPVar3);
    if (iVar2 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Degree must be greater than or equal to zero",&local_71);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
      return __return_storage_ptr__;
    }
  case kRbfKernel:
    this = Specification::Kernel::rbfkernel(local_18);
    dVar4 = Specification::RBFKernel::gamma(this,extraout_XMM0_Qa_00);
    if (dVar4 < 0.0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Gamma must be greater than or equal to zero",&local_99);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::allocator<char>::~allocator(&local_99);
      return __return_storage_ptr__;
    }
    break;
  case kSigmoidKernel:
    this_00 = Specification::Kernel::sigmoidkernel(local_18);
    dVar4 = Specification::SigmoidKernel::gamma(this_00,extraout_XMM0_Qa_01);
    if (dVar4 < 0.0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c0,"Gamma must be greater than or equal to zero",&local_c1);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::allocator<char>::~allocator(&local_c1);
      return __return_storage_ptr__;
    }
  case kLinearKernel:
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"You must specify a supported kernel type",&local_e9);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    return __return_storage_ptr__;
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result validateKernel(const Specification::Kernel& kernel) {
        switch (kernel.kernel_case()) {
            case Specification::Kernel::kPolyKernel:
                if(kernel.polykernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                if(kernel.polykernel().degree() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Degree must be greater than or equal to zero");
            case Specification::Kernel::kRbfKernel:
                if(kernel.rbfkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
                break;
            case Specification::Kernel::kSigmoidKernel:
                if(kernel.sigmoidkernel().gamma() < 0)
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Gamma must be greater than or equal to zero");
            case Specification::Kernel::kLinearKernel:
                break;
            default:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "You must specify a supported kernel type");
        }
        return Result();
    }